

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int syncJournal(Pager *pPager,int newHdr)

{
  PCache *pPVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  PgHdr *pPVar5;
  uint uVar6;
  sqlite3_int64 sVar7;
  bool bVar8;
  u8 zHeader [12];
  u8 aMagic [8];
  undefined8 local_48;
  uint local_40;
  long local_38;
  
  iVar2 = sqlite3PagerExclusiveLock(pPager);
  if (iVar2 != 0) {
    return iVar2;
  }
  if (pPager->noSync != '\0') goto LAB_0015ee2c;
  if ((pPager->jfd->pMethods == (sqlite3_io_methods *)0x0) || (pPager->journalMode == '\x04')) {
    pPager->journalHdr = pPager->journalOff;
    goto LAB_0015ee2c;
  }
  uVar3 = (*pPager->fd->pMethods->xDeviceCharacteristics)(pPager->fd);
  iVar2 = 0;
  if ((uVar3 >> 9 & 1) == 0) {
    local_48 = 0xd763a120f905d5d9;
    uVar6 = pPager->nRec;
    local_40 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    if (pPager->journalOff == 0) {
      sVar7 = 0;
    }
    else {
      sVar7 = ((pPager->journalOff + -1) / (long)(ulong)pPager->sectorSize + 1) *
              (ulong)pPager->sectorSize;
    }
    iVar2 = (*pPager->jfd->pMethods->xRead)(pPager->jfd,&local_38,8,sVar7);
    if ((iVar2 == 0) && (iVar2 = 0, local_38 == -0x289c5edf06fa2a27)) {
      iVar2 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,"",1,sVar7);
    }
    if ((iVar2 == 0x20a) || (iVar2 == 0)) {
      if (((uVar3 >> 10 & 1) == 0) && (pPager->fullSync != '\0')) {
        if (pPager->syncFlags == 0) {
          iVar2 = 0;
        }
        else {
          iVar2 = (*pPager->jfd->pMethods->xSync)(pPager->jfd,(uint)pPager->syncFlags);
        }
        if (iVar2 != 0) goto LAB_0015ef38;
      }
      iVar2 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,&local_48,0xc,pPager->journalHdr);
      bVar8 = iVar2 == 0;
    }
    else {
LAB_0015ef38:
      bVar8 = false;
    }
    if (bVar8) goto LAB_0015ef5e;
    bVar8 = false;
  }
  else {
LAB_0015ef5e:
    if ((uVar3 >> 10 & 1) == 0) {
      uVar6 = (uint)(pPager->syncFlags == 3) << 4 | (uint)pPager->syncFlags;
      if (uVar6 == 0) {
        iVar4 = 0;
      }
      else {
        iVar4 = (*pPager->jfd->pMethods->xSync)(pPager->jfd,uVar6);
      }
      if (iVar4 == 0) goto LAB_0015ef8f;
LAB_0015efb7:
      iVar2 = iVar4;
      bVar8 = false;
    }
    else {
LAB_0015ef8f:
      pPager->journalHdr = pPager->journalOff;
      if ((newHdr != 0) && ((uVar3 & 0x200) == 0)) {
        pPager->nRec = 0;
        iVar4 = writeJournalHdr(pPager);
        if (iVar4 != 0) goto LAB_0015efb7;
      }
      bVar8 = true;
    }
  }
  if (!bVar8) {
    return iVar2;
  }
LAB_0015ee2c:
  pPVar1 = pPager->pPCache;
  for (pPVar5 = pPVar1->pDirty; pPVar5 != (PgHdr *)0x0; pPVar5 = pPVar5->pDirtyNext) {
    *(byte *)&pPVar5->flags = (byte)pPVar5->flags & 0xf7;
  }
  pPVar1->pSynced = pPVar1->pDirtyTail;
  pPager->eState = '\x04';
  return 0;
}

Assistant:

static int syncJournal(Pager *pPager, int newHdr){
  int rc;                         /* Return code */

  assert( pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );
  assert( !pagerUseWal(pPager) );

  rc = sqlite3PagerExclusiveLock(pPager);
  if( rc!=SQLITE_OK ) return rc;

  if( !pPager->noSync ){
    assert( !pPager->tempFile );
    if( isOpen(pPager->jfd) && pPager->journalMode!=PAGER_JOURNALMODE_MEMORY ){
      const int iDc = sqlite3OsDeviceCharacteristics(pPager->fd);
      assert( isOpen(pPager->jfd) );

      if( 0==(iDc&SQLITE_IOCAP_SAFE_APPEND) ){
        /* This block deals with an obscure problem. If the last connection
        ** that wrote to this database was operating in persistent-journal
        ** mode, then the journal file may at this point actually be larger
        ** than Pager.journalOff bytes. If the next thing in the journal
        ** file happens to be a journal-header (written as part of the
        ** previous connection's transaction), and a crash or power-failure 
        ** occurs after nRec is updated but before this connection writes 
        ** anything else to the journal file (or commits/rolls back its 
        ** transaction), then SQLite may become confused when doing the 
        ** hot-journal rollback following recovery. It may roll back all
        ** of this connections data, then proceed to rolling back the old,
        ** out-of-date data that follows it. Database corruption.
        **
        ** To work around this, if the journal file does appear to contain
        ** a valid header following Pager.journalOff, then write a 0x00
        ** byte to the start of it to prevent it from being recognized.
        **
        ** Variable iNextHdrOffset is set to the offset at which this
        ** problematic header will occur, if it exists. aMagic is used 
        ** as a temporary buffer to inspect the first couple of bytes of
        ** the potential journal header.
        */
        i64 iNextHdrOffset;
        u8 aMagic[8];
        u8 zHeader[sizeof(aJournalMagic)+4];

        memcpy(zHeader, aJournalMagic, sizeof(aJournalMagic));
        put32bits(&zHeader[sizeof(aJournalMagic)], pPager->nRec);

        iNextHdrOffset = journalHdrOffset(pPager);
        rc = sqlite3OsRead(pPager->jfd, aMagic, 8, iNextHdrOffset);
        if( rc==SQLITE_OK && 0==memcmp(aMagic, aJournalMagic, 8) ){
          static const u8 zerobyte = 0;
          rc = sqlite3OsWrite(pPager->jfd, &zerobyte, 1, iNextHdrOffset);
        }
        if( rc!=SQLITE_OK && rc!=SQLITE_IOERR_SHORT_READ ){
          return rc;
        }

        /* Write the nRec value into the journal file header. If in
        ** full-synchronous mode, sync the journal first. This ensures that
        ** all data has really hit the disk before nRec is updated to mark
        ** it as a candidate for rollback.
        **
        ** This is not required if the persistent media supports the
        ** SAFE_APPEND property. Because in this case it is not possible 
        ** for garbage data to be appended to the file, the nRec field
        ** is populated with 0xFFFFFFFF when the journal header is written
        ** and never needs to be updated.
        */
        if( pPager->fullSync && 0==(iDc&SQLITE_IOCAP_SEQUENTIAL) ){
          PAGERTRACE(("SYNC journal of %d\n", PAGERID(pPager)));
          IOTRACE(("JSYNC %p\n", pPager))
          rc = sqlite3OsSync(pPager->jfd, pPager->syncFlags);
          if( rc!=SQLITE_OK ) return rc;
        }
        IOTRACE(("JHDR %p %lld\n", pPager, pPager->journalHdr));
        rc = sqlite3OsWrite(
            pPager->jfd, zHeader, sizeof(zHeader), pPager->journalHdr
        );
        if( rc!=SQLITE_OK ) return rc;
      }
      if( 0==(iDc&SQLITE_IOCAP_SEQUENTIAL) ){
        PAGERTRACE(("SYNC journal of %d\n", PAGERID(pPager)));
        IOTRACE(("JSYNC %p\n", pPager))
        rc = sqlite3OsSync(pPager->jfd, pPager->syncFlags| 
          (pPager->syncFlags==SQLITE_SYNC_FULL?SQLITE_SYNC_DATAONLY:0)
        );
        if( rc!=SQLITE_OK ) return rc;
      }

      pPager->journalHdr = pPager->journalOff;
      if( newHdr && 0==(iDc&SQLITE_IOCAP_SAFE_APPEND) ){
        pPager->nRec = 0;
        rc = writeJournalHdr(pPager);
        if( rc!=SQLITE_OK ) return rc;
      }
    }else{
      pPager->journalHdr = pPager->journalOff;
    }
  }

  /* Unless the pager is in noSync mode, the journal file was just 
  ** successfully synced. Either way, clear the PGHDR_NEED_SYNC flag on 
  ** all pages.
  */
  sqlite3PcacheClearSyncFlags(pPager->pPCache);
  pPager->eState = PAGER_WRITER_DBMOD;
  assert( assert_pager_state(pPager) );
  return SQLITE_OK;
}